

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WeakReferenceDictionary.h
# Opt level: O0

void __thiscall
JsUtil::
SplitWeakDictionary<int,_Js::JavascriptSymbol_*,_false,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
::Resize(SplitWeakDictionary<int,_Js::JavascriptSymbol_*,_false,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
         *this)

{
  int iVar1;
  RecyclerWeakReferenceRegionItem<Js::JavascriptSymbol_*> *pRVar2;
  code *pcVar3;
  Type *ppJVar4;
  bool bVar5;
  uint uVar6;
  int **ppiVar7;
  ValueEntry<int,_JsUtil::(anonymous_namespace)::ValueEntryData<int>_> **ppVVar8;
  undefined4 *puVar9;
  RecyclerWeakReferenceRegionItem<Js::JavascriptSymbol_*> **ppRVar10;
  JavascriptSymbol *pJVar11;
  int *value;
  type_conflict local_64;
  int bucket;
  int local_5c;
  hash_t hashCode;
  int currentEntry;
  uint i;
  WeakType *newWeakRefs;
  EntryType *newEntries;
  int *newBuckets;
  int local_30;
  uint newBucketCount;
  int modIndex;
  uint local_1c;
  int newSize;
  AutoDoResize autoDoResize;
  SplitWeakDictionary<int,_Js::JavascriptSymbol_*,_false,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::NoResizeLock,_Memory::Recycler>
  *this_local;
  
  autoDoResize.lock = (NoResizeLock *)this;
  AutoDoResize::AutoDoResize((AutoDoResize *)&stack0xffffffffffffffe8,(NoResizeLock *)this);
  local_1c = DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>::GetNextSize(this->count);
  local_30 = 0x4b;
  newBuckets._4_4_ =
       DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>::GetBucketSize(local_1c,&local_30);
  newEntries = (EntryType *)0x0;
  newWeakRefs = (WeakType *)0x0;
  _i = (RecyclerWeakReferenceRegionItem<Js::JavascriptSymbol_*> *)0x0;
  if (newBuckets._4_4_ == this->bucketCount) {
    newWeakRefs = (WeakType *)AllocateEntries(this,local_1c,true);
    _i = AllocateWeakRefs(this,local_1c);
    Memory::
    CopyArray<JsUtil::(anonymous_namespace)::ValueEntry<int,JsUtil::(anonymous_namespace)::ValueEntryData<int>>,JsUtil::(anonymous_namespace)::ValueEntry<int,JsUtil::(anonymous_namespace)::ValueEntryData<int>>,Memory::Recycler>
              ((ValueEntry<int,_JsUtil::(anonymous_namespace)::ValueEntryData<int>_> *)newWeakRefs,
               (long)(int)local_1c,&this->entries,(long)this->count);
    Memory::
    CopyArray<Memory::RecyclerWeakReferenceRegionItem<Js::JavascriptSymbol*>,Memory::RecyclerWeakReferenceRegionItem<Js::JavascriptSymbol*>,Memory::Recycler>
              (_i,(long)(int)local_1c,&this->weakRefs,(long)this->count);
    Memory::
    WriteBarrierPtr<JsUtil::(anonymous_namespace)::ValueEntry<int,_JsUtil::(anonymous_namespace)::ValueEntryData<int>_>_>
    ::operator=(&this->entries,
                (ValueEntry<int,_JsUtil::(anonymous_namespace)::ValueEntryData<int>_> *)newWeakRefs)
    ;
    Memory::WriteBarrierPtr<Memory::RecyclerWeakReferenceRegionItem<Js::JavascriptSymbol_*>_>::
    operator=(&this->weakRefs,_i);
    this->size = local_1c;
    this->modFunctionIndex = local_30;
    currentEntry = 1;
  }
  else {
    Allocate(this,(int **)&newEntries,(EntryType **)&newWeakRefs,(WeakType **)&i,newBuckets._4_4_,
             local_1c);
    this->modFunctionIndex = local_30;
    this->count = 0;
    for (hashCode = 0; hashCode < this->bucketCount; hashCode = hashCode + 1) {
      ppiVar7 = Memory::WriteBarrierPtr::operator_cast_to_int__((WriteBarrierPtr *)&this->buckets);
      if (-1 < (*ppiVar7)[hashCode]) {
        ppiVar7 = Memory::WriteBarrierPtr::operator_cast_to_int__((WriteBarrierPtr *)&this->buckets)
        ;
        local_5c = (*ppiVar7)[hashCode];
        while (local_5c != -1) {
          ppVVar8 = Memory::WriteBarrierPtr::operator_cast_to_ValueEntry__
                              ((WriteBarrierPtr *)&this->entries);
          bVar5 = IsFreeEntry(*ppVVar8 + local_5c);
          if (bVar5) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar9 = 1;
            bVar5 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/WeakReferenceDictionary.h"
                               ,0x245,"(false)",
                               "Following bucket chains should not result in free entries");
            if (!bVar5) {
              pcVar3 = (code *)invalidInstructionException();
              (*pcVar3)();
            }
            puVar9 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
            *puVar9 = 0;
            break;
          }
          ppRVar10 = Memory::WriteBarrierPtr::operator_cast_to_RecyclerWeakReferenceRegionItem__
                               ((WriteBarrierPtr *)&this->weakRefs);
          pJVar11 = Memory::RecyclerWeakReferenceRegionItem::operator_cast_to_JavascriptSymbol_
                              ((RecyclerWeakReferenceRegionItem *)(*ppRVar10 + local_5c));
          if (pJVar11 == (JavascriptSymbol *)0x0) {
            ppVVar8 = Memory::WriteBarrierPtr::operator_cast_to_ValueEntry__
                                ((WriteBarrierPtr *)&this->entries);
            local_5c = (*ppVVar8)[local_5c].super_ValueEntryData<int>.next;
          }
          else {
            local_64 = GetKey<false>(this,local_5c);
            bucket = GetHashCodeWithKey<int>(&local_64);
            uVar6 = GetBucket(bucket,newBuckets._4_4_,this->modFunctionIndex);
            *(int *)((long)&newWeakRefs->ptr + (long)this->count * 8 + 4) =
                 (&(newEntries->super_ValueEntryData<int>).value)[(int)uVar6];
            iVar1 = this->count;
            ppJVar4 = &newWeakRefs->ptr;
            ppVVar8 = Memory::WriteBarrierPtr::operator_cast_to_ValueEntry__
                                ((WriteBarrierPtr *)&this->entries);
            value = anon_unknown_4::
                    ValueEntry<int,_JsUtil::(anonymous_namespace)::ValueEntryData<int>_>::Value
                              (*ppVVar8 + local_5c);
            anon_unknown_4::ValueEntry<int,_JsUtil::(anonymous_namespace)::ValueEntryData<int>_>::
            SetValue((ValueEntry<int,_JsUtil::(anonymous_namespace)::ValueEntryData<int>_> *)
                     (ppJVar4 + iVar1),value);
            ppRVar10 = Memory::WriteBarrierPtr::operator_cast_to_RecyclerWeakReferenceRegionItem__
                                 ((WriteBarrierPtr *)&this->weakRefs);
            pRVar2 = *ppRVar10;
            iVar1 = this->count;
            _i[iVar1].ptr = pRVar2[local_5c].ptr;
            _i[iVar1].heapBlock = pRVar2[local_5c].heapBlock;
            (&(newEntries->super_ValueEntryData<int>).value)[(int)uVar6] = this->count;
            this->count = this->count + 1;
            ppVVar8 = Memory::WriteBarrierPtr::operator_cast_to_ValueEntry__
                                ((WriteBarrierPtr *)&this->entries);
            local_5c = (*ppVVar8)[local_5c].super_ValueEntryData<int>.next;
          }
        }
      }
    }
    this->freeCount = 0;
    this->freeList = 0;
    Memory::WriteBarrierPtr<int>::operator=(&this->buckets,(int *)newEntries);
    Memory::
    WriteBarrierPtr<JsUtil::(anonymous_namespace)::ValueEntry<int,_JsUtil::(anonymous_namespace)::ValueEntryData<int>_>_>
    ::operator=(&this->entries,
                (ValueEntry<int,_JsUtil::(anonymous_namespace)::ValueEntryData<int>_> *)newWeakRefs)
    ;
    Memory::WriteBarrierPtr<Memory::RecyclerWeakReferenceRegionItem<Js::JavascriptSymbol_*>_>::
    operator=(&this->weakRefs,_i);
    this->bucketCount = newBuckets._4_4_;
    this->size = local_1c;
    currentEntry = 0;
  }
  AutoDoResize::~AutoDoResize((AutoDoResize *)&stack0xffffffffffffffe8);
  return;
}

Assistant:

void Resize()
        {
            AutoDoResize autoDoResize(*this);
            __analysis_assert(count > 1);

            int newSize = SizePolicy::GetNextSize(count);
            int modIndex = UNKNOWN_MOD_INDEX;
            uint newBucketCount = SizePolicy::GetBucketSize(newSize, &modIndex);

            __analysis_assume(newSize > count);
            int* newBuckets = nullptr;
            EntryType* newEntries = nullptr;
            WeakType* newWeakRefs = nullptr;
            if (newBucketCount == bucketCount)
            {
                // no need to rehash
                newEntries = AllocateEntries(newSize);
                newWeakRefs = AllocateWeakRefs(newSize);
                CopyArray<EntryType>(newEntries, newSize, entries, count);
                CopyArray<WeakType>(newWeakRefs, newSize, weakRefs, count); // TODO: concurrency issues?

                this->entries = newEntries;
                this->weakRefs = newWeakRefs;
                this->size = newSize;
                this->modFunctionIndex = modIndex;
                return;
            }

            Allocate(&newBuckets, &newEntries, &newWeakRefs, newBucketCount, newSize);

            this->modFunctionIndex = modIndex;

            // Need to re-bucket the entries
            // Also need to account for whether the weak refs have been collected
            // Have to go in order so we can remove entries as appropriate
            this->count = 0;
            for (uint i = 0; i < this->bucketCount; ++i)
            {
                if (this->buckets[i] < 0)
                {
                    continue;
                }

                for (int currentEntry = this->buckets[i]; currentEntry != -1; )
                {
                    if (IsFreeEntry(entries[currentEntry]))
                    {
                        // Entry is free; this shouldn't happen, but stop following the chain
                        AssertMsg(false, "Following bucket chains should not result in free entries");
                        break;
                    }
                    if (this->weakRefs[currentEntry] == nullptr)
                    {
                        // The weak ref has been collected; don't bother bringing it to the new collection
                        currentEntry = this->entries[currentEntry].next;
                        continue;
                    }

                    hash_t hashCode = GetHashCodeWithKey<TBKey>(this->GetKey(currentEntry));
                    int bucket = GetBucket(hashCode, newBucketCount, modFunctionIndex);
                    newEntries[count].next = newBuckets[bucket];
                    newEntries[count].SetValue(this->entries[currentEntry].Value());
                    newWeakRefs[count] = this->weakRefs[currentEntry];
                    newBuckets[bucket] = count;
                    ++count;

                    currentEntry = this->entries[currentEntry].next;
                }
            }
            this->freeCount = 0;
            this->freeList = 0;
            this->buckets = newBuckets;
            this->entries = newEntries;
            this->weakRefs = newWeakRefs;
            this->bucketCount = newBucketCount;
            this->size = newSize;

        }